

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O0

PacketList * __thiscall
ASDCP::MXF::Partition::PacketList::DeleteMDObjectByID(PacketList *this,UUID *ObjectID)

{
  bool bVar1;
  reference ppVar2;
  key_type *in_RDX;
  _Self local_30;
  _Self local_28;
  iterator mi;
  UUID *ObjectID_local;
  PacketList *this_local;
  
  local_28._M_node =
       (_Base_ptr)
       std::
       map<Kumu::UUID,_ASDCP::MXF::InterchangeObject_*,_std::less<Kumu::UUID>,_std::allocator<std::pair<const_Kumu::UUID,_ASDCP::MXF::InterchangeObject_*>_>_>
       ::find((map<Kumu::UUID,_ASDCP::MXF::InterchangeObject_*,_std::less<Kumu::UUID>,_std::allocator<std::pair<const_Kumu::UUID,_ASDCP::MXF::InterchangeObject_*>_>_>
               *)((ObjectID->super_Identifier<16U>).m_Value + 0xf),in_RDX);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<Kumu::UUID,_ASDCP::MXF::InterchangeObject_*,_std::less<Kumu::UUID>,_std::allocator<std::pair<const_Kumu::UUID,_ASDCP::MXF::InterchangeObject_*>_>_>
       ::end((map<Kumu::UUID,_ASDCP::MXF::InterchangeObject_*,_std::less<Kumu::UUID>,_std::allocator<std::pair<const_Kumu::UUID,_ASDCP::MXF::InterchangeObject_*>_>_>
              *)((ObjectID->super_Identifier<16U>).m_Value + 0xf));
  bVar1 = std::operator==(&local_28,&local_30);
  if (bVar1) {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_FAIL);
  }
  else {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_Kumu::UUID,_ASDCP::MXF::InterchangeObject_*>_>::
             operator*(&local_28);
    if (ppVar2->second != (InterchangeObject *)0x0) {
      (*(ppVar2->second->super_KLVPacket)._vptr_KLVPacket[1])();
    }
    std::
    map<Kumu::UUID,ASDCP::MXF::InterchangeObject*,std::less<Kumu::UUID>,std::allocator<std::pair<Kumu::UUID_const,ASDCP::MXF::InterchangeObject*>>>
    ::erase_abi_cxx11_((map<Kumu::UUID,ASDCP::MXF::InterchangeObject*,std::less<Kumu::UUID>,std::allocator<std::pair<Kumu::UUID_const,ASDCP::MXF::InterchangeObject*>>>
                        *)((ObjectID->super_Identifier<16U>).m_Value + 0xf),
                       (iterator)local_28._M_node);
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::Partition::PacketList::DeleteMDObjectByID(const UUID& ObjectID)
{
  std::map<UUID, InterchangeObject*>::iterator mi = m_Map.find(ObjectID);
  
  if ( mi == m_Map.end() )
    {
       return RESULT_FAIL;
    }

  delete (*mi).second;
  m_Map.erase(mi);
  return RESULT_OK;
}